

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeFuncInfoArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar8 = *(uint *)buffer;
  uVar1 = *(uint *)(buffer + 5);
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 <= (ulong)uVar8 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1245,
                                "(serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength()"
                               );
    if (!bVar3) goto LAB_007c749d;
    *puVar5 = 0;
  }
  pbVar6 = ByteBlock::GetBuffer(deserializeInto);
  uVar10 = (ulong)*(uint *)buffer;
  *(uint *)(pbVar6 + uVar10) = uVar1;
  uVar8 = *(uint *)buffer;
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 < (ulong)uVar8 + (ulong)uVar1 * 8 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1248,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar3) {
LAB_007c749d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  lVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = uVar1;
  }
  for (uVar9 = 0; uVar8 * 2 != uVar9; uVar9 = uVar9 + 2) {
    *(undefined4 *)(pbVar6 + uVar9 * 4 + uVar10 + 4) = *(undefined4 *)(buffer + (lVar7 >> 0x1e) + 9)
    ;
    *(undefined4 *)(pbVar6 + uVar9 * 4 + uVar10 + 8) =
         *(undefined4 *)(buffer + (long)((int)uVar9 + 1) * 4 + 9);
    lVar7 = lVar7 + 0x200000000;
  }
  return buffer + (long)(int)(uVar1 * 2) * 4 + 9;
}

Assistant:

const byte *
    DeserializeFuncInfoArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const SerializedFuncInfoArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxFuncInfoArray);
#endif
        auto count = serialized->count;

        Assert(serialized->offset + sizeof(AuxArray<FuncInfoEntry>) < deserializeInto->GetLength());
        auto result = (AuxArray<FuncInfoEntry> *)(deserializeInto->GetBuffer() + serialized->offset);
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto elements = (int*)(serialized+1);
        for(int i=0;i<count;++i)
        {
            result->elements[i].nestedIndex = elements[i*2];
            result->elements[i].scopeSlot = elements[i*2+1];
        }
        auto current = buffer + sizeof(serialization_alignment const SerializedFuncInfoArray) + (count * 2 * sizeof(int));
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxFuncInfoArray);
#endif
        return current;
    }